

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testtool.c
# Opt level: O2

int get_framename(frameex1 *fx_addr68k)

{
  LispPTR *pLVar1;
  
  pLVar1 = NativeAligned4FromLAddr
                     (*(LispPTR *)
                       ((long)&fx_addr68k->fnheader +
                       (ulong)(*(ushort *)&fx_addr68k->field_0x2 >> 6 & 8)));
  return pLVar1[2] & 0xfffffff;
}

Assistant:

int get_framename(struct frameex1 *fx_addr68k) {
  struct fnhead *fnheader;
  LispPTR scratch;

/* Get FNHEAD */
#ifdef BIGVM
  if (fx_addr68k->validnametable == 0) {
    scratch = (unsigned int)(fx_addr68k->fnheader);
  } else {
    scratch = (unsigned int)(fx_addr68k->nametable);
  }
#else
  if (fx_addr68k->validnametable == 0) {
    scratch = (unsigned int)(fx_addr68k->hi2fnheader << 16);
    scratch |= (unsigned int)(fx_addr68k->lofnheader);
  } else {
    scratch = (unsigned int)(fx_addr68k->hi2nametable << 16);
    scratch |= (unsigned int)(fx_addr68k->lonametable);
  }
#endif /* BIGVM */
  fnheader = (struct fnhead *)NativeAligned4FromLAddr(scratch);
  return (fnheader->framename);
}